

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void testGetElementById(void)

{
  FILE *__stream;
  int iVar1;
  streambuf *psVar2;
  ElementData *pEVar3;
  AttrMap *pAVar4;
  char *__s1;
  mapped_type *pmVar5;
  undefined8 uVar6;
  allocator<char> local_549;
  key_type local_548;
  allocator<char> local_521;
  key_type local_520;
  allocator<char> local_4f9;
  string local_4f8;
  undefined1 local_4d8 [8];
  Node result;
  Node node;
  string source;
  stringstream local_398 [8];
  stringstream buffer;
  ostream local_388 [376];
  undefined1 local_210 [8];
  ifstream file;
  
  std::ifstream::ifstream(local_210,"source/parseTest.html",8);
  std::__cxx11::stringstream::stringstream(local_398);
  psVar2 = (streambuf *)std::ifstream::rdbuf();
  std::ostream::operator<<(local_388,psVar2);
  std::__cxx11::stringstream::str();
  crawler::parse((Node *)&result.parent.
                          super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 (string *)
                 &node.parent.super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4f8,"main",&local_4f9);
  crawler::Node::getElementById
            ((Node *)local_4d8,
             (Node *)&result.parent.super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,&local_4f8);
  std::__cxx11::string::~string((string *)&local_4f8);
  std::allocator<char>::~allocator(&local_4f9);
  printNode((Node *)local_4d8);
  test_count = test_count + 1;
  pEVar3 = crawler::Node::getElementData((Node *)local_4d8);
  pAVar4 = crawler::ElementData::getAttributes_abi_cxx11_(pEVar3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_520,"class",&local_521);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::at(pAVar4,&local_520);
  __s1 = (char *)std::__cxx11::string::c_str();
  iVar1 = strcmp(__s1,"test");
  std::__cxx11::string::~string((string *)&local_520);
  std::allocator<char>::~allocator(&local_521);
  __stream = _stderr;
  if (iVar1 == 0) {
    test_pass = test_pass + 1;
  }
  else {
    pEVar3 = crawler::Node::getElementData((Node *)local_4d8);
    pAVar4 = crawler::ElementData::getAttributes_abi_cxx11_(pEVar3);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_548,"class",&local_549);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::at(pAVar4,&local_548);
    uVar6 = std::__cxx11::string::c_str();
    fprintf(__stream,"function %s(): %s:%d  Assertion `%s` failed. expect: %s actual: %s\n",
            "testGetElementById",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ramsayleung[P]crawler/test.cpp"
            ,0x96,
            "strcmp((result.getElementData().getAttributes().at(\"class\").c_str()), (\"test\")) == 0"
            ,uVar6,"test",pmVar5);
    std::__cxx11::string::~string((string *)&local_548);
    std::allocator<char>::~allocator(&local_549);
    main_ret = 1;
  }
  crawler::Node::~Node((Node *)local_4d8);
  crawler::Node::~Node
            ((Node *)&result.parent.super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
  std::__cxx11::string::~string
            ((string *)
             &node.parent.super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__cxx11::stringstream::~stringstream(local_398);
  std::ifstream::~ifstream(local_210);
  return;
}

Assistant:

void testGetElementById() {
  std::ifstream file("source/parseTest.html");
  std::stringstream buffer;
  buffer << file.rdbuf();
  std::string source = buffer.str();
  crawler::Node node = crawler::parse(source);
  crawler::Node result = node.getElementById("main");
  printNode(result);
  ASSERT_CSTRING_EQ(result.getElementData().getAttributes().at("class").c_str(),
                    "test");
}